

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cc
# Opt level: O1

bool anon_unknown.dwarf_2990d4::write_stream(ostream *os,WriteOptions *options,Node *stream)

{
  pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  byte bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 this;
  bool bVar6;
  undefined1 uVar7;
  undefined1 extraout_AL;
  ostream *poVar8;
  Token *pTVar9;
  element_type *extraout_RAX;
  element_type *peVar10;
  element_type *extraout_RAX_00;
  element_type *extraout_RAX_01;
  element_type *extraout_RAX_02;
  element_type *extraout_RAX_03;
  element_type *extraout_RAX_04;
  element_type *extraout_RAX_05;
  element_type *peVar11;
  pointer psVar12;
  string_view sVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  Token local_b8;
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  Node local_78;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  element_type *local_58;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  element_type *local_40;
  undefined1 *local_38;
  
  local_b0._0_8_ = trieste::yaml::Documents;
  trieste::operator/((WFLookup *)local_d8,stream,(Token *)local_b0);
  this = local_c8._0_8_;
  uVar4 = local_d8._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_c8._0_8_ + 8) = *(_Atomic_word *)(local_c8._0_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_c8._0_8_ + 8) = *(_Atomic_word *)(local_c8._0_8_ + 8) + 1;
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_);
  }
  peVar11 = (element_type *)
            (((Nodes *)(uVar4 + 0x58))->
            super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  peVar10 = (element_type *)
            (((Nodes *)(uVar4 + 0x58))->
            super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_40 = peVar10;
  if (peVar11 != peVar10) {
    bVar3 = 0;
    do {
      local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (peVar11->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
           super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (peVar11->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
           super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
        if (local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
      }
      local_b0._0_8_ = trieste::yaml::Directives;
      local_60 = local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
      trieste::operator/((WFLookup *)local_d8,&local_78,(Token *)local_b0);
      uVar4 = local_d8._8_8_;
      local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_c8._0_8_ + 8) = *(_Atomic_word *)(local_c8._0_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_c8._0_8_ + 8) = *(_Atomic_word *)(local_c8._0_8_ + 8) + 1;
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_);
      }
      psVar12 = (((Nodes *)(uVar4 + 0x58))->
                super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      psVar1 = (((Nodes *)(uVar4 + 0x58))->
               super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if ((!(bool)(~bVar3 & 1 | psVar12 == psVar1)) && (options->canonical == true)) {
        do {
          peVar10 = (psVar12->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
          p_Var2 = (psVar12->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            }
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            }
          }
          if ((peVar10->type_).def == (TokenDef *)&trieste::yaml::VersionDirective) {
            sVar13 = trieste::Location::view(&peVar10->location_);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (os,sVar13._M_str,sVar13._M_len);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,(options->newline)._M_dataplus._M_p,
                       (options->newline)._M_string_length);
          }
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
            CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
          psVar12 = psVar12 + 1;
        } while (psVar12 != psVar1);
      }
      local_b0._0_8_ = &trieste::yaml::Value;
      trieste::operator/((WFLookup *)local_d8,&local_78,(Token *)local_b0);
      uVar4 = local_c8._0_8_;
      peVar10 = (element_type *)local_d8._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_c8._0_8_ + 8) = *(_Atomic_word *)(local_c8._0_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_c8._0_8_ + 8) = *(_Atomic_word *)(local_c8._0_8_ + 8) + 1;
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_);
      }
      local_b0._0_8_ = &trieste::yaml::DocumentStart;
      trieste::operator/((WFLookup *)local_d8,&local_78,(Token *)local_b0);
      uVar5 = local_d8._8_8_;
      local_88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_c8._0_8_ + 8) = *(_Atomic_word *)(local_c8._0_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_c8._0_8_ + 8) = *(_Atomic_word *)(local_c8._0_8_ + 8) + 1;
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_);
      }
      local_b0._0_8_ = &trieste::yaml::DocumentEnd;
      trieste::operator/((WFLookup *)local_d8,&local_78,(Token *)local_b0);
      local_68 = (element_type *)local_d8._8_8_;
      local_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_c8._0_8_ + 8) = *(_Atomic_word *)(local_c8._0_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_c8._0_8_ + 8) = *(_Atomic_word *)(local_c8._0_8_ + 8) + 1;
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_);
      }
      if (options->canonical == true) {
        if ((((Token *)((long)peVar10 + 0x10))->def == (TokenDef *)trieste::yaml::Empty) &&
           ((local_68->location_).len == 0)) {
          local_38 = trieste::yaml::Null;
          local_b0._0_8_ = &local_a0;
          local_a0._0_4_ = 0x6c6c756e;
          local_b0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4;
          local_a0._4_4_ = local_a0._4_4_ & 0xffffff00;
          trieste::SourceDef::synthetic((SourceDef *)local_d8,(string *)local_b0);
          local_c8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_c8._8_8_ = local_b0._8_8_;
          trieste::NodeDef::create
                    ((NodeDef *)&stack0xffffffffffffffa8,(Token *)&stack0xffffffffffffffc8,
                     (Location *)local_d8);
          if ((element_type *)local_d8._8_8_ != (element_type *)0x0) {
            CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
          }
          peVar10 = local_58;
          local_f0 = _Stack_50._M_pi;
          local_58 = (element_type *)0x0;
          _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
          }
          if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._0_8_ != &local_a0) {
            operator_delete((void *)local_b0._0_8_,CONCAT44(local_a0._4_4_,local_a0._0_4_) + 1);
          }
        }
        else {
          local_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
        }
LAB_0018855e:
        std::__ostream_insert<char,std::char_traits<char>>(os,"---",3);
        local_d8._0_8_ = trieste::yaml::Mapping;
        local_d8._8_8_ = trieste::yaml::FlowMapping;
        local_c8._0_8_ = trieste::yaml::Sequence;
        local_c8._8_8_ = trieste::yaml::FlowSequence;
        pTVar9 = std::
                 __find_if<trieste::Token_const*,__gnu_cxx::__ops::_Iter_equals_val<trieste::Token_const>>
                           (local_d8,&local_b8,&peVar10->type_);
        if ((pTVar9 == &local_b8) ||
           ((peVar10->children).
            super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (peVar10->children).
            super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          if ((peVar10->type_).def != (TokenDef *)trieste::yaml::Empty) {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    (os,(options->newline)._M_dataplus._M_p,(options->newline)._M_string_length);
        }
      }
      else {
        local_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
        if (((Location *)(uVar5 + 0x18))->len != 0) goto LAB_0018855e;
      }
      local_d8._0_8_ = (Wellformed *)0x0;
      local_d8._8_8_ = (element_type *)0x0;
      if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_f0->_M_use_count = local_f0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_f0->_M_use_count = local_f0->_M_use_count + 1;
        }
      }
      local_b0._0_8_ = peVar10;
      local_b0._8_8_ = local_f0;
      bVar6 = write_value(os,options,(Spaces *)local_d8,(Node *)local_b0);
      peVar10 = (element_type *)(ulong)bVar6;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
        peVar10 = extraout_RAX;
      }
      if ((!bVar6) &&
         (((local_68->location_).len != 0 || (peVar10 = local_68, (options->emit_docend & 1U) != 0))
         )) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"...",3);
        peVar10 = (element_type *)
                  std::__ostream_insert<char,std::char_traits<char>>
                            (os,(options->newline)._M_dataplus._M_p,
                             (options->newline)._M_string_length);
      }
      p_Var2 = local_88;
      if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
        peVar10 = extraout_RAX_00;
      }
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        peVar10 = extraout_RAX_01;
      }
      if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
        peVar10 = extraout_RAX_02;
      }
      if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
        peVar10 = extraout_RAX_03;
      }
      if (local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        peVar10 = extraout_RAX_04;
      }
      if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
        peVar10 = extraout_RAX_05;
      }
      peVar11 = (element_type *)&peVar11->type_;
      bVar3 = 1;
    } while (peVar11 != local_40);
  }
  uVar7 = SUB81(peVar10,0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
    uVar7 = extraout_AL;
  }
  return (bool)uVar7;
}

Assistant:

bool write_stream(std::ostream& os, WriteOptions& options, Node stream)
  {
    Node documents = stream / Documents;
    bool not_first = false;
    for (auto document : *documents)
    {
      write_document(os, options, document, not_first);
      not_first = true;
    }
    return false;
  }